

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O2

void __thiscall
Equality_componentNotEqualByReset_Test::Equality_componentNotEqualByReset_Test
          (Equality_componentNotEqualByReset_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_0012e3d0;
  return;
}

Assistant:

TEST(Equality, componentNotEqualByReset)
{
    libcellml::ComponentPtr c1 = libcellml::Component::create("c");
    libcellml::ComponentPtr c2 = libcellml::Component::create("c");

    libcellml::ResetPtr r1 = libcellml::Reset::create();
    libcellml::ResetPtr r2 = libcellml::Reset::create();

    r1->setOrder(5);
    r2->setOrder(7);

    c1->addReset(r1);
    c2->addReset(r2);

    EXPECT_FALSE(c1->equals(c2));
    EXPECT_FALSE(c2->equals(c1));
}